

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Dial.cxx
# Opt level: O0

void __thiscall Fl_Dial::draw(Fl_Dial *this,int X,int Y,int W,int H)

{
  short sVar1;
  short sVar2;
  byte bVar3;
  uchar uVar4;
  Fl_Boxtype FVar5;
  Fl_Color FVar6;
  int iVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double local_98;
  int foo;
  double angle;
  int H_local;
  int W_local;
  int Y_local;
  int X_local;
  Fl_Dial *this_local;
  
  bVar3 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar3 & 0x80) != 0) {
    FVar5 = Fl_Widget::box((Fl_Widget *)this);
    FVar6 = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,FVar5,X,Y,W,H,FVar6);
  }
  FVar5 = Fl_Widget::box((Fl_Widget *)this);
  iVar7 = Fl::box_dx(FVar5);
  W_local = iVar7 + X;
  FVar5 = Fl_Widget::box((Fl_Widget *)this);
  iVar7 = Fl::box_dy(FVar5);
  H_local = iVar7 + Y;
  FVar5 = Fl_Widget::box((Fl_Widget *)this);
  iVar7 = Fl::box_dw(FVar5);
  angle._4_4_ = W - iVar7;
  FVar5 = Fl_Widget::box((Fl_Widget *)this);
  iVar7 = Fl::box_dh(FVar5);
  angle._0_4_ = H - iVar7;
  sVar1 = *(short *)&(this->super_Fl_Valuator).field_0xa6;
  sVar2 = *(short *)&(this->super_Fl_Valuator).field_0xa4;
  dVar9 = Fl_Valuator::value(&this->super_Fl_Valuator);
  dVar10 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
  dVar11 = Fl_Valuator::maximum(&this->super_Fl_Valuator);
  dVar12 = Fl_Valuator::minimum(&this->super_Fl_Valuator);
  dVar9 = ((double)((int)sVar1 - (int)sVar2) * (dVar9 - dVar10)) / (dVar11 - dVar12) +
          (double)(int)*(short *)&(this->super_Fl_Valuator).field_0xa4;
  uVar4 = Fl_Widget::type((Fl_Widget *)this);
  if (uVar4 == '\x02') {
    FVar5 = Fl_Widget::box((Fl_Widget *)this);
    bVar8 = false;
    if (0x16 < (int)FVar5) {
      FVar5 = Fl_Widget::box((Fl_Widget *)this);
      iVar7 = Fl::box_dx(FVar5);
      bVar8 = iVar7 != 0;
    }
    if (bVar8) {
      W_local = W_local + -1;
      H_local = H_local + -1;
      angle._4_4_ = angle._4_4_ + 2;
      angle._0_4_ = angle._0_4_ + 2;
    }
    iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar7 == 0) {
      FVar6 = Fl_Widget::color((Fl_Widget *)this);
      FVar6 = fl_inactive(FVar6);
      fl_color(FVar6);
    }
    else {
      FVar6 = Fl_Widget::color((Fl_Widget *)this);
      fl_color(FVar6);
    }
    if (dVar9 <= (double)(int)*(short *)&(this->super_Fl_Valuator).field_0xa4) {
      local_98 = -90.0 - dVar9;
    }
    else {
      local_98 = 630.0 - dVar9;
    }
    fl_pie(W_local,H_local,angle._4_4_,angle._0_4_,
           (double)(0x10e - *(short *)&(this->super_Fl_Valuator).field_0xa4),local_98);
    iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar7 == 0) {
      FVar6 = Fl_Widget::selection_color((Fl_Widget *)this);
      FVar6 = fl_inactive(FVar6);
      fl_color(FVar6);
    }
    else {
      FVar6 = Fl_Widget::selection_color((Fl_Widget *)this);
      fl_color(FVar6);
    }
    fl_pie(W_local,H_local,angle._4_4_,angle._0_4_,270.0 - dVar9,
           (double)(0x10e - *(short *)&(this->super_Fl_Valuator).field_0xa4));
    if (bVar8) {
      iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
      if (iVar7 == 0) {
        FVar6 = fl_inactive(0);
        fl_color(FVar6);
      }
      else {
        fl_color(0);
      }
      fl_arc(W_local,H_local,angle._4_4_,angle._0_4_,0.0,360.0);
    }
  }
  else {
    bVar3 = Fl_Widget::damage((Fl_Widget *)this);
    if ((bVar3 & 0x80) == 0) {
      iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
      if (iVar7 == 0) {
        FVar6 = Fl_Widget::color((Fl_Widget *)this);
        FVar6 = fl_inactive(FVar6);
        fl_color(FVar6);
      }
      else {
        FVar6 = Fl_Widget::color((Fl_Widget *)this);
        fl_color(FVar6);
      }
      fl_pie(W_local + 1,H_local + 1,angle._4_4_ + -2,angle._0_4_ + -2,0.0,360.0);
    }
    fl_push_matrix();
    fl_translate((double)(W_local + angle._4_4_ / 2) - 0.5,(double)(H_local + angle._0_4_ / 2) - 0.5
                );
    fl_scale((double)(angle._4_4_ + -1),(double)(angle._0_4_ + -1));
    fl_rotate(45.0 - dVar9);
    iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
    if (iVar7 == 0) {
      FVar6 = Fl_Widget::selection_color((Fl_Widget *)this);
      FVar6 = fl_inactive(FVar6);
      fl_color(FVar6);
    }
    else {
      FVar6 = Fl_Widget::selection_color((Fl_Widget *)this);
      fl_color(FVar6);
    }
    uVar4 = Fl_Widget::type((Fl_Widget *)this);
    if (uVar4 == '\0') {
      fl_begin_polygon();
      fl_circle(-0.2,0.2,0.07);
      fl_end_polygon();
      iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
      if (iVar7 == 0) {
        FVar6 = fl_inactive(0);
        fl_color(FVar6);
      }
      else {
        fl_color(0);
      }
      fl_begin_loop();
      fl_circle(-0.2,0.2,0.07);
      fl_end_loop();
    }
    else {
      fl_begin_polygon();
      fl_vertex(0.0,0.0);
      fl_vertex(-0.04,0.0);
      fl_vertex(-0.25,0.25);
      fl_vertex(0.0,0.04);
      fl_end_polygon();
      iVar7 = Fl_Widget::active_r((Fl_Widget *)this);
      if (iVar7 == 0) {
        FVar6 = fl_inactive(0);
        fl_color(FVar6);
      }
      else {
        fl_color(0);
      }
      fl_begin_loop();
      fl_vertex(0.0,0.0);
      fl_vertex(-0.04,0.0);
      fl_vertex(-0.25,0.25);
      fl_vertex(0.0,0.04);
      fl_end_loop();
    }
    fl_pop_matrix();
  }
  return;
}

Assistant:

void Fl_Dial::draw(int X, int Y, int W, int H) {
  if (damage()&FL_DAMAGE_ALL) draw_box(box(), X, Y, W, H, color());
  X += Fl::box_dx(box());
  Y += Fl::box_dy(box());
  W -= Fl::box_dw(box());
  H -= Fl::box_dh(box());
  double angle = (a2-a1)*(value()-minimum())/(maximum()-minimum()) + a1;
  if (type() == FL_FILL_DIAL) {
    // foo: draw this nicely in certain round box types
    int foo = (box() > _FL_ROUND_UP_BOX && Fl::box_dx(box()));
    if (foo) {X--; Y--; W+=2; H+=2;}
    if (active_r()) fl_color(color());
    else fl_color(fl_inactive(color()));
    fl_pie(X, Y, W, H, 270-a1, angle > a1 ? 360+270-angle : 270-360-angle);
    if (active_r()) fl_color(selection_color());
    else fl_color(fl_inactive(selection_color()));
    fl_pie(X, Y, W, H, 270-angle, 270-a1);
    if (foo) {
      if (active_r()) fl_color(FL_FOREGROUND_COLOR);
      else fl_color(fl_inactive(FL_FOREGROUND_COLOR));
      fl_arc(X, Y, W, H, 0, 360);
    }
    return;
  }
  if (!(damage()&FL_DAMAGE_ALL)) {
    if (active_r()) fl_color(color());
    else fl_color(fl_inactive(color()));
    fl_pie(X+1, Y+1, W-2, H-2, 0, 360);
  }
  fl_push_matrix();
  fl_translate(X+W/2-.5, Y+H/2-.5);
  fl_scale(W-1, H-1);
  fl_rotate(45-angle);
  if (active_r()) fl_color(selection_color());
  else fl_color(fl_inactive(selection_color()));
  if (type()) { // FL_LINE_DIAL
    fl_begin_polygon();
    fl_vertex(0.0,   0.0);
    fl_vertex(-0.04, 0.0);
    fl_vertex(-0.25, 0.25);
    fl_vertex(0.0,   0.04);
    fl_end_polygon();
    if (active_r()) fl_color(FL_FOREGROUND_COLOR);
    else fl_color(fl_inactive(FL_FOREGROUND_COLOR));
    fl_begin_loop();
    fl_vertex(0.0,   0.0);
    fl_vertex(-0.04, 0.0);
    fl_vertex(-0.25, 0.25);
    fl_vertex(0.0,   0.04);
    fl_end_loop();
  } else {
    fl_begin_polygon(); fl_circle(-0.20, 0.20, 0.07); fl_end_polygon();
    if (active_r()) fl_color(FL_FOREGROUND_COLOR);
    else fl_color(fl_inactive(FL_FOREGROUND_COLOR));
    fl_begin_loop(); fl_circle(-0.20, 0.20, 0.07); fl_end_loop();
  }
  fl_pop_matrix();
}